

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

bool __thiscall
jpge::jpeg_encoder::jpg_open(jpeg_encoder *this,int p_x_res,int p_y_res,int src_channels)

{
  int32 (*__src) [64];
  uint uVar1;
  uint8 (*pauVar2) [17];
  uint8 (*pauVar3) [256];
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  uint8 *puVar7;
  ulong uVar8;
  long lVar9;
  undefined1 *puVar10;
  uint uVar11;
  long lVar12;
  
  this->m_num_components = '\x03';
  switch((this->m_params).m_subsampling) {
  case Y_ONLY:
    this->m_num_components = '\x01';
    this->m_comp_h_samp[0] = '\x01';
    this->m_comp_v_samp[0] = '\x01';
    break;
  case H1V1:
    this->m_comp_v_samp[1] = '\x01';
    this->m_comp_v_samp[2] = '\x01';
    this->m_comp_h_samp[0] = '\x01';
    this->m_comp_h_samp[1] = '\x01';
    this->m_comp_h_samp[2] = '\x01';
    this->m_comp_v_samp[0] = '\x01';
    break;
  case H2V1:
    this->m_comp_h_samp[0] = '\x02';
    *(undefined4 *)(this->m_comp_h_samp + 1) = 0x1010101;
    this->m_comp_v_samp[2] = '\x01';
    this->m_mcu_x = 0x10;
    goto LAB_001550ae;
  case H2V2:
    this->m_comp_h_samp[0] = '\x02';
    this->m_comp_h_samp[1] = '\x01';
    this->m_comp_h_samp[2] = '\x01';
    this->m_comp_v_samp[0] = '\x02';
    this->m_comp_v_samp[1] = '\x01';
    this->m_comp_v_samp[2] = '\x01';
    this->m_mcu_x = 0x10;
    iVar6 = 0x10;
    goto LAB_001550b3;
  default:
    goto switchD_00155059_default;
  }
  this->m_mcu_x = 8;
LAB_001550ae:
  iVar6 = 8;
LAB_001550b3:
  this->m_mcu_y = iVar6;
switchD_00155059_default:
  this->m_image_x = p_x_res;
  this->m_image_y = p_y_res;
  this->m_image_bpp = src_channels;
  this->m_image_bpl = src_channels * p_x_res;
  iVar6 = this->m_mcu_x;
  uVar1 = this->m_mcu_y;
  uVar11 = -iVar6 & (p_x_res + iVar6) - 1U;
  this->m_image_x_mcu = uVar11;
  this->m_image_y_mcu = -uVar1 & (p_y_res + uVar1) - 1;
  lVar12 = (long)(int)uVar11 * (ulong)this->m_num_components;
  this->m_image_bpl_xlt = (uint)this->m_num_components * p_x_res;
  iVar5 = (int)lVar12;
  this->m_image_bpl_mcu = iVar5;
  this->m_mcus_per_row = (int)uVar11 / iVar6;
  puVar7 = (uint8 *)malloc((long)(int)(iVar5 * uVar1));
  this->m_mcu_lines[0] = puVar7;
  if (puVar7 == (uint8 *)0x0) {
    uVar4 = 0;
  }
  else {
    if (1 < (int)uVar1) {
      puVar7 = this->m_mcu_lines[0];
      lVar9 = 0;
      do {
        puVar7 = puVar7 + lVar12;
        this->m_mcu_lines[lVar9 + 1] = puVar7;
        lVar9 = lVar9 + 1;
      } while ((ulong)uVar1 - 1 != lVar9);
    }
    __src = this->m_quantization_tables;
    iVar6 = (this->m_params).m_quality;
    if ((this->m_params).m_use_std_tables == false) {
      if (iVar6 < 0x32) {
        iVar6 = (int)(5000 / (long)iVar6);
      }
      else {
        iVar6 = iVar6 * -2 + 200;
      }
      lVar12 = 0;
      do {
        lVar9 = (long)*(short *)((long)&s_alt_quant + lVar12) * (long)iVar6;
        uVar8 = SUB168(SEXT816(lVar9 + 0x32) * SEXT816(-0x5c28f5c28f5c28f5),8) + lVar9 + 0x32;
        iVar5 = (int)(uVar8 >> 6) - (int)((long)uVar8 >> 0x3f);
        if (iVar5 < 2) {
          iVar5 = 1;
        }
        if (0xfe < iVar5) {
          iVar5 = 0xff;
        }
        *(int *)((long)*__src + lVar12 * 2) = iVar5;
        lVar12 = lVar12 + 2;
      } while ((int)lVar12 != 0x80);
      memcpy(this->m_quantization_tables + 1,__src,0x100);
    }
    else {
      if (iVar6 < 0x32) {
        iVar6 = (int)(5000 / (long)iVar6);
      }
      else {
        iVar6 = iVar6 * -2 + 200;
      }
      lVar12 = 0;
      do {
        lVar9 = (long)*(short *)((long)&s_std_lum_quant + lVar12) * (long)iVar6;
        uVar8 = SUB168(SEXT816(lVar9 + 0x32) * SEXT816(-0x5c28f5c28f5c28f5),8) + lVar9 + 0x32;
        iVar5 = (int)(uVar8 >> 6) - (int)((long)uVar8 >> 0x3f);
        if (iVar5 < 2) {
          iVar5 = 1;
        }
        if (0xfe < iVar5) {
          iVar5 = 0xff;
        }
        *(int *)((long)*__src + lVar12 * 2) = iVar5;
        lVar12 = lVar12 + 2;
      } while ((int)lVar12 != 0x80);
      puVar10 = s_std_croma_quant;
      if ((this->m_params).m_no_chroma_discrim_flag != false) {
        puVar10 = (undefined1 *)&s_std_lum_quant;
      }
      iVar6 = (this->m_params).m_quality;
      if (iVar6 < 0x32) {
        iVar6 = (int)(5000 / (long)iVar6);
      }
      else {
        iVar6 = iVar6 * -2 + 200;
      }
      lVar12 = 0;
      do {
        uVar8 = SUB168(SEXT816((long)*(short *)((long)puVar10 + lVar12 * 2) * (long)iVar6 + 0x32) *
                       SEXT816(-0x5c28f5c28f5c28f5),8) +
                (long)*(short *)((long)puVar10 + lVar12 * 2) * (long)iVar6 + 0x32;
        iVar5 = (int)(uVar8 >> 6) - (int)((long)uVar8 >> 0x3f);
        if (iVar5 < 2) {
          iVar5 = 1;
        }
        if (0xfe < iVar5) {
          iVar5 = 0xff;
        }
        this->m_quantization_tables[1][lVar12] = iVar5;
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 0x40);
    }
    this->m_out_buf_left = 0x800;
    this->m_pOut_buf = this->m_out_buf;
    if ((this->m_params).m_two_pass_flag == true) {
      this->m_bit_buffer = 0;
      this->m_bits_in = 0;
      this->m_mcu_y_ofs = '\0';
      memset(this->m_huff_count,0,0x100c);
      this->m_pass_num = '\x01';
    }
    else {
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 1) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 2) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 3) = '\x05';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 4) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 5) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 6) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 7) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 8) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 9) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 10) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xb) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xc) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xd) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xe) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xf) = '\0';
      this->m_huff_bits[0][0x10] = '\0';
      *(uint8 *)((long)(this->m_huff_val + 0) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_val + 0) + 1) = '\x01';
      *(uint8 *)((long)(this->m_huff_val + 0) + 2) = '\x02';
      *(uint8 *)((long)(this->m_huff_val + 0) + 3) = '\x03';
      *(uint8 *)((long)(this->m_huff_val + 0) + 4) = '\x04';
      *(uint8 *)((long)(this->m_huff_val + 0) + 5) = '\x05';
      *(uint8 *)((long)(this->m_huff_val + 0) + 6) = '\x06';
      *(uint8 *)((long)(this->m_huff_val + 0) + 7) = '\a';
      *(uint8 *)((long)(this->m_huff_val + 0) + 8) = '\b';
      *(uint8 *)((long)(this->m_huff_val + 0) + 9) = '\t';
      *(uint8 *)((long)(this->m_huff_val + 0) + 10) = '\n';
      *(uint8 *)((long)(this->m_huff_val + 0) + 0xb) = '\v';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 1) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 2) = '\x02';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 3) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 4) = '\x03';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 5) = '\x03';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 6) = '\x02';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 7) = '\x04';
      pauVar2 = this->m_huff_bits;
      *(uint8 *)((long)(pauVar2 + 2) + 8) = '\x03';
      *(uint8 *)((long)(pauVar2 + 2) + 9) = '\x05';
      *(uint8 *)((long)(pauVar2 + 2) + 10) = '\x05';
      *(uint8 *)((long)(pauVar2 + 2) + 0xb) = '\x04';
      *(uint8 *)((long)(pauVar2 + 2) + 0xc) = '\x04';
      *(uint8 *)((long)(pauVar2 + 2) + 0xd) = '\0';
      *(uint8 *)((long)(pauVar2 + 2) + 0xe) = '\0';
      *(uint8 *)((long)(pauVar2 + 2) + 0xf) = '\x01';
      this->m_huff_bits[2][0x10] = '}';
      memcpy(this->m_huff_val + 2,s_ac_lum_val,0x100);
      this->m_huff_bits[1][0x10] = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 1) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 2) = '\x03';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 3) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 4) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 5) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 6) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 7) = '\x01';
      pauVar2 = this->m_huff_bits;
      *(uint8 *)((long)(pauVar2 + 1) + 8) = '\x01';
      *(uint8 *)((long)(pauVar2 + 1) + 9) = '\x01';
      *(uint8 *)((long)(pauVar2 + 1) + 10) = '\x01';
      *(uint8 *)((long)(pauVar2 + 1) + 0xb) = '\x01';
      *(uint8 *)((long)(pauVar2 + 1) + 0xc) = '\0';
      *(uint8 *)((long)(pauVar2 + 1) + 0xd) = '\0';
      *(uint8 *)((long)(pauVar2 + 1) + 0xe) = '\0';
      *(uint8 *)((long)(pauVar2 + 1) + 0xf) = '\0';
      *(uint8 *)((long)(this->m_huff_val + 1) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_val + 1) + 1) = '\x01';
      *(uint8 *)((long)(this->m_huff_val + 1) + 2) = '\x02';
      *(uint8 *)((long)(this->m_huff_val + 1) + 3) = '\x03';
      *(uint8 *)((long)(this->m_huff_val + 1) + 4) = '\x04';
      *(uint8 *)((long)(this->m_huff_val + 1) + 5) = '\x05';
      *(uint8 *)((long)(this->m_huff_val + 1) + 6) = '\x06';
      *(uint8 *)((long)(this->m_huff_val + 1) + 7) = '\a';
      pauVar3 = this->m_huff_val;
      *(uint8 *)((long)(pauVar3 + 1) + 8) = '\b';
      *(uint8 *)((long)(pauVar3 + 1) + 9) = '\t';
      *(uint8 *)((long)(pauVar3 + 1) + 10) = '\n';
      *(uint8 *)((long)(pauVar3 + 1) + 0xb) = '\v';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 1) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 2) = '\x02';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 3) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 4) = '\x02';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 5) = '\x04';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 6) = '\x04';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 7) = '\x03';
      pauVar2 = this->m_huff_bits;
      *(uint8 *)((long)(pauVar2 + 3) + 8) = '\x04';
      *(uint8 *)((long)(pauVar2 + 3) + 9) = '\a';
      *(uint8 *)((long)(pauVar2 + 3) + 10) = '\x05';
      *(uint8 *)((long)(pauVar2 + 3) + 0xb) = '\x04';
      *(uint8 *)((long)(pauVar2 + 3) + 0xc) = '\x04';
      *(uint8 *)((long)(pauVar2 + 3) + 0xd) = '\0';
      *(uint8 *)((long)(pauVar2 + 3) + 0xe) = '\x01';
      *(uint8 *)((long)(pauVar2 + 3) + 0xf) = '\x02';
      this->m_huff_bits[3][0x10] = 'w';
      memcpy(this->m_huff_val + 3,s_ac_chroma_val,0x100);
      second_pass_init(this);
    }
    uVar4 = this->m_all_stream_writes_succeeded;
  }
  return (bool)uVar4;
}

Assistant:

bool jpeg_encoder::jpg_open(int p_x_res, int p_y_res, int src_channels)
	{
		m_num_components = 3;
		switch (m_params.m_subsampling)
		{
		case Y_ONLY:
		{
			m_num_components = 1;
			m_comp_h_samp[0] = 1; m_comp_v_samp[0] = 1;
			m_mcu_x = 8; m_mcu_y = 8;
			break;
		}
		case H1V1:
		{
			m_comp_h_samp[0] = 1; m_comp_v_samp[0] = 1;
			m_comp_h_samp[1] = 1; m_comp_v_samp[1] = 1;
			m_comp_h_samp[2] = 1; m_comp_v_samp[2] = 1;
			m_mcu_x = 8; m_mcu_y = 8;
			break;
		}
		case H2V1:
		{
			m_comp_h_samp[0] = 2; m_comp_v_samp[0] = 1;
			m_comp_h_samp[1] = 1; m_comp_v_samp[1] = 1;
			m_comp_h_samp[2] = 1; m_comp_v_samp[2] = 1;
			m_mcu_x = 16; m_mcu_y = 8;
			break;
		}
		case H2V2:
		{
			m_comp_h_samp[0] = 2; m_comp_v_samp[0] = 2;
			m_comp_h_samp[1] = 1; m_comp_v_samp[1] = 1;
			m_comp_h_samp[2] = 1; m_comp_v_samp[2] = 1;
			m_mcu_x = 16; m_mcu_y = 16;
		}
		}

		m_image_x = p_x_res; m_image_y = p_y_res;
		m_image_bpp = src_channels;
		m_image_bpl = m_image_x * src_channels;
		m_image_x_mcu = (m_image_x + m_mcu_x - 1) & (~(m_mcu_x - 1));
		m_image_y_mcu = (m_image_y + m_mcu_y - 1) & (~(m_mcu_y - 1));
		m_image_bpl_xlt = m_image_x * m_num_components;
		m_image_bpl_mcu = m_image_x_mcu * m_num_components;
		m_mcus_per_row = m_image_x_mcu / m_mcu_x;

		if ((m_mcu_lines[0] = static_cast<uint8*>(jpge_malloc(m_image_bpl_mcu * m_mcu_y))) == NULL) return false;
		for (int i = 1; i < m_mcu_y; i++)
			m_mcu_lines[i] = m_mcu_lines[i - 1] + m_image_bpl_mcu;

		if (m_params.m_use_std_tables)
		{
			compute_quant_table(m_quantization_tables[0], s_std_lum_quant);
			compute_quant_table(m_quantization_tables[1], m_params.m_no_chroma_discrim_flag ? s_std_lum_quant : s_std_croma_quant);
		}
		else
		{
			compute_quant_table(m_quantization_tables[0], s_alt_quant);
			memcpy(m_quantization_tables[1], m_quantization_tables[0], sizeof(m_quantization_tables[1]));
		}

		m_out_buf_left = JPGE_OUT_BUF_SIZE;
		m_pOut_buf = m_out_buf;

		if (m_params.m_two_pass_flag)
		{
			clear_obj(m_huff_count);
			first_pass_init();
		}
		else
		{
			memcpy(m_huff_bits[0 + 0], s_dc_lum_bits, 17);    memcpy(m_huff_val[0 + 0], s_dc_lum_val, DC_LUM_CODES);
			memcpy(m_huff_bits[2 + 0], s_ac_lum_bits, 17);    memcpy(m_huff_val[2 + 0], s_ac_lum_val, AC_LUM_CODES);
			memcpy(m_huff_bits[0 + 1], s_dc_chroma_bits, 17); memcpy(m_huff_val[0 + 1], s_dc_chroma_val, DC_CHROMA_CODES);
			memcpy(m_huff_bits[2 + 1], s_ac_chroma_bits, 17); memcpy(m_huff_val[2 + 1], s_ac_chroma_val, AC_CHROMA_CODES);
			if (!second_pass_init()) return false;   // in effect, skip over the first pass
		}
		return m_all_stream_writes_succeeded;
	}